

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::descriptor_unittest::ValidationErrorTest_EnumNegativeReservedFieldError_Test::
~ValidationErrorTest_EnumNegativeReservedFieldError_Test
          (ValidationErrorTest_EnumNegativeReservedFieldError_Test *this)

{
  ValidationErrorTest_EnumNegativeReservedFieldError_Test *this_local;
  
  ~ValidationErrorTest_EnumNegativeReservedFieldError_Test(this);
  operator_delete(this,0x88);
  return;
}

Assistant:

TEST_F(ValidationErrorTest, EnumNegativeReservedFieldError) {
  BuildFileWithErrors(
      "name: \"foo.proto\" "
      "enum_type {"
      "  name: \"Foo\""
      "  value { name:\"BAR\" number:-15 }"
      "  reserved_range { start: -20 end: -10 }"
      "}",

      "foo.proto: BAR: NUMBER: Enum value \"BAR\" uses reserved number -15.\n");
}